

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void md5_128(void *key,int len,uint32_t seed,void *out)

{
  md5_context ctx;
  md5_context mStack_118;
  
  md5_starts(&mStack_118);
  mStack_118.state[0] = mStack_118.state[0] ^ seed;
  md5_update(&mStack_118,(uchar *)key,len);
  md5_finish(&mStack_118,(uchar *)out);
  return;
}

Assistant:

inline void md5_128(const void *key, int len, uint32_t seed, void *out) {
  md5_context ctx;
  md5_starts( &ctx );
  ctx.state[0] ^= seed;
  md5_update( &ctx, (unsigned char *)key, len );
  md5_finish( &ctx, (unsigned char *)out );
  //memset( &ctx.buffer, 0, 64+64+64 ); // for buffer, ipad, opad
}